

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O2

Request<capnproto_test::capnp::test::TestMembrane::WaitForeverParams,_capnproto_test::capnp::test::TestMembrane::WaitForeverResults>
* __thiscall
capnproto_test::capnp::test::TestMembrane::Client::waitForeverRequest
          (Request<capnproto_test::capnp::test::TestMembrane::WaitForeverParams,_capnproto_test::capnp::test::TestMembrane::WaitForeverResults>
           *__return_storage_ptr__,Client *this,Maybe<capnp::MessageSize> *sizeHint)

{
  Maybe<capnp::MessageSize> local_20;
  
  local_20.ptr.isSet = (sizeHint->ptr).isSet;
  if (local_20.ptr.isSet == true) {
    local_20.ptr.field_1.value.wordCount = (sizeHint->ptr).field_1.value.wordCount;
    local_20.ptr.field_1._8_8_ = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
  }
  ::capnp::Capability::Client::
  newCall<capnproto_test::capnp::test::TestMembrane::WaitForeverParams,capnproto_test::capnp::test::TestMembrane::WaitForeverResults>
            (__return_storage_ptr__,
             (Client *)((long)&this->_vptr_Client + (long)this->_vptr_Client[-3]),0xc07d8dcd80a69c0c
             ,4,&local_20);
  return __return_storage_ptr__;
}

Assistant:

::capnp::Request< ::capnproto_test::capnp::test::TestMembrane::WaitForeverParams,  ::capnproto_test::capnp::test::TestMembrane::WaitForeverResults>
TestMembrane::Client::waitForeverRequest(::kj::Maybe< ::capnp::MessageSize> sizeHint) {
  return newCall< ::capnproto_test::capnp::test::TestMembrane::WaitForeverParams,  ::capnproto_test::capnp::test::TestMembrane::WaitForeverResults>(
      0xc07d8dcd80a69c0cull, 4, sizeHint);
}